

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O2

void __thiscall dg::llvmdg::SCD::computePostDominators(SCD *this,Function *F)

{
  DomTreeNode *Node;
  DomSetType *pDVar1;
  _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
  *p_Var2;
  _Base_ptr p_Var3;
  Function *pFVar4;
  Function *pFVar5;
  BasicBlock *pdf;
  PostDominanceFrontiers PDF;
  PostDominatorTreeWrapperPass wrapper;
  Function *local_108;
  Function *local_100;
  Function *local_f8;
  _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_f0;
  BasicBlock *local_e8;
  _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  local_e0;
  PostDominatorTreeWrapperPass local_b0 [32];
  BasicBlock local_90 [96];
  
  llvm::PostDominatorTreeWrapperPass::PostDominatorTreeWrapperPass(local_b0);
  llvm::PostDominatorTreeWrapperPass::runOnFunction((Function *)local_b0);
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100 = F + 0x48;
  local_f0 = (_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->dependencies;
  pFVar4 = F + 0x50;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pFVar4 = *(Function **)pFVar4, pFVar4 != local_100) {
    pFVar5 = pFVar4 + -0x18;
    if (pFVar4 == (Function *)0x0) {
      pFVar5 = (Function *)0x0;
    }
    local_f8 = pFVar4;
    Node = (DomTreeNode *)llvm::DominatorTreeBase<llvm::BasicBlock,true>::getNode(local_90);
    pDVar1 = PostDominanceFrontiers::calculate
                       ((PostDominanceFrontiers *)&local_e0,(PostDominatorTree *)local_90,Node);
    for (p_Var3 = (pDVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pDVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      local_e8 = *(BasicBlock **)(p_Var3 + 1);
      local_108 = pFVar5;
      p_Var2 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
                *)std::__detail::
                  _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_f0,(key_type *)&local_108);
      std::
      _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
      ::_M_insert_unique<llvm::BasicBlock*const&>(p_Var2,&local_e8);
      p_Var2 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
                *)std::__detail::
                  _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->dependentBlocks,&local_e8);
      local_108 = pFVar5;
      std::
      _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
      ::_M_insert_unique<llvm::BasicBlock*>(p_Var2,(BasicBlock **)&local_108);
    }
    pFVar4 = local_f8 + 8;
  }
  std::
  _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  ::~_Rb_tree(&local_e0);
  llvm::PostDominatorTreeWrapperPass::~PostDominatorTreeWrapperPass(local_b0);
  return;
}

Assistant:

void SCD::computePostDominators(llvm::Function &F) {
    DBG_SECTION_BEGIN(cda, "Computing post dominators for function "
                                   << F.getName().str());
    using namespace llvm;

    PostDominatorTree *pdtree = nullptr;

    DBG(cda, "Computing post dominator tree");
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 9))

    auto pdtreeptr =
            std::unique_ptr<PostDominatorTree>(new PostDominatorTree());
    pdtree = pdtreeptr.get();
    pdtree->runOnFunction(F); // compute post-dominator tree for this function

#else // LLVM >= 3.9

    PostDominatorTreeWrapperPass wrapper;
    wrapper.runOnFunction(F);
    pdtree = &wrapper.getPostDomTree();

#ifndef NDEBUG
    wrapper.verifyAnalysis();
#endif

    DBG(cda, "Computing post dominator frontiers and adding CD");

#if 0 // this does not work as expected
    llvm::ReverseIDFCalculator PDF(*pdtree);
    for (auto& B : F) {
        llvm::SmallPtrSet<llvm::BasicBlock *, 1> blocks;
        blocks.insert(&B);
        PDF.setDefiningBlocks(blocks);

        SmallVector<BasicBlock *, 8> pdfrontiers;
        PDF.calculate(pdfrontiers);

        // FIXME: reserve the memory
        for (auto *pdf : pdfrontiers) {
            dependencies[&B].insert(pdf);
            dependentBlocks[pdf].insert(&B);
        }
    }
#endif

    PostDominanceFrontiers PDF;

    for (auto &B : F) {
        auto *pdtreenode = pdtree->getNode(&B);
        assert(pdtreenode && "Do not have a node in post-dom tree");
        auto &pdfrontiers = PDF.calculate(*pdtree, pdtreenode);
        for (auto *pdf : pdfrontiers) {
            dependencies[&B].insert(pdf);
            dependentBlocks[pdf].insert(&B);
        }
    }

#endif // LLVM < 3.9

    DBG_SECTION_END(cda, "Done computing post dominators for function "
                                 << F.getName().str());
}